

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

void dasm_setup(BuildCtx *ctx,void *actionlist)

{
  int iVar1;
  dasm_State *pdVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  
  pdVar2 = ctx->D;
  pdVar2->actionlist = (dasm_ActList)actionlist;
  pdVar2->status = 0;
  pdVar2->section = pdVar2->sections;
  iVar5 = 0;
  memset(pdVar2->lglabels,0,pdVar2->lgsize);
  if (pdVar2->pclabels != (int *)0x0) {
    memset(pdVar2->pclabels,0,pdVar2->pcsize);
  }
  iVar1 = pdVar2->maxsection;
  piVar4 = &pdVar2->sections[0].ofs;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    piVar4[-2] = iVar5;
    ((dasm_Section *)(piVar4 + -8))->rbuf = *(int **)(piVar4 + -6) + -(long)iVar5;
    *piVar4 = 0;
    piVar4 = piVar4 + 10;
    iVar5 = iVar5 + 0x1000000;
  }
  return;
}

Assistant:

void dasm_setup(Dst_DECL, const void *actionlist)
{
  dasm_State *D = Dst_REF;
  int i;
  D->actionlist = (dasm_ActList)actionlist;
  D->status = DASM_S_OK;
  D->section = &D->sections[0];
  memset((void *)D->lglabels, 0, D->lgsize);
  if (D->pclabels) memset((void *)D->pclabels, 0, D->pcsize);
  for (i = 0; i < D->maxsection; i++) {
    D->sections[i].pos = DASM_SEC2POS(i);
    D->sections[i].rbuf = D->sections[i].buf - D->sections[i].pos;
    D->sections[i].ofs = 0;
  }
}